

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode easy_transfer(Curl_multi *multi)

{
  bool bVar1;
  time_t tVar2;
  CURLMsg *pCVar3;
  timeval tVar4;
  timeval newer;
  int local_78;
  CURLMsg *msg;
  int sleep_ms;
  timeval after;
  __suseconds_t local_48;
  int local_3c;
  int local_38;
  int rc;
  int still_running;
  int without_fds;
  timeval before;
  CURLMcode local_18;
  CURLcode result;
  CURLMcode mcode;
  _Bool done;
  Curl_multi *multi_local;
  
  bVar1 = false;
  local_18 = CURLM_OK;
  before.tv_usec._4_4_ = CURLE_OK;
  rc = 0;
  while (!bVar1 && local_18 == CURLM_OK) {
    local_38 = 0;
    tVar4 = curlx_tvnow();
    after.tv_usec = tVar4.tv_sec;
    _still_running = after.tv_usec;
    local_48 = tVar4.tv_usec;
    before.tv_sec = local_48;
    local_18 = curl_multi_wait(multi,(curl_waitfd *)0x0,0,1000,&local_3c);
    if (local_18 == CURLM_OK) {
      if (local_3c == 0) {
        newer = curlx_tvnow();
        tVar4.tv_usec = before.tv_sec;
        tVar4.tv_sec = _still_running;
        tVar2 = curlx_tvdiff(newer,tVar4);
        if (tVar2 < 0xb) {
          rc = rc + 1;
          if (2 < rc) {
            if (rc < 10) {
              local_78 = 1 << ((char)rc - 1U & 0x1f);
            }
            else {
              local_78 = 1000;
            }
            Curl_wait_ms(local_78);
          }
        }
        else {
          rc = 0;
        }
      }
      else {
        rc = 0;
      }
      local_18 = curl_multi_perform(multi,&local_38);
    }
    if (((local_18 == CURLM_OK) && (local_38 == 0)) &&
       (pCVar3 = curl_multi_info_read(multi,&local_3c), pCVar3 != (CURLMsg *)0x0)) {
      before.tv_usec._4_4_ = (pCVar3->data).result;
      bVar1 = true;
    }
  }
  if ((local_18 != CURLM_OK) &&
     (before.tv_usec._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT, local_18 == CURLM_OUT_OF_MEMORY)) {
    before.tv_usec._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return before.tv_usec._4_4_;
}

Assistant:

static CURLcode easy_transfer(struct Curl_multi *multi)
{
  bool done = FALSE;
  CURLMcode mcode = CURLM_OK;
  CURLcode result = CURLE_OK;
  struct timeval before;
  int without_fds = 0;  /* count number of consecutive returns from
                           curl_multi_wait() without any filedescriptors */

  while(!done && !mcode) {
    int still_running = 0;
    int rc;

    before = curlx_tvnow();
    mcode = curl_multi_wait(multi, NULL, 0, 1000, &rc);

    if(!mcode) {
      if(!rc) {
        struct timeval after = curlx_tvnow();

        /* If it returns without any filedescriptor instantly, we need to
           avoid busy-looping during periods where it has nothing particular
           to wait for */
        if(curlx_tvdiff(after, before) <= 10) {
          without_fds++;
          if(without_fds > 2) {
            int sleep_ms = without_fds < 10 ? (1 << (without_fds - 1)) : 1000;
            Curl_wait_ms(sleep_ms);
          }
        }
        else
          /* it wasn't "instant", restart counter */
          without_fds = 0;
      }
      else
        /* got file descriptor, restart counter */
        without_fds = 0;

      mcode = curl_multi_perform(multi, &still_running);
    }

    /* only read 'still_running' if curl_multi_perform() return OK */
    if(!mcode && !still_running) {
      CURLMsg *msg = curl_multi_info_read(multi, &rc);
      if(msg) {
        result = msg->data.result;
        done = TRUE;
      }
    }
  }

  /* Make sure to return some kind of error if there was a multi problem */
  if(mcode) {
    result = (mcode == CURLM_OUT_OF_MEMORY) ? CURLE_OUT_OF_MEMORY :
              /* The other multi errors should never happen, so return
                 something suitably generic */
              CURLE_BAD_FUNCTION_ARGUMENT;
  }

  return result;
}